

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraCodeBlocksGenerator::CreateProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs)

{
  pointer pcVar1;
  string *psVar2;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string outputDir;
  string projectName;
  string filename;
  string sessionFilename;
  long *local_140;
  size_t local_138;
  long local_130 [2];
  string local_120;
  string local_100;
  string local_e0;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_88;
  undefined8 local_70;
  undefined1 *local_68;
  undefined8 local_60;
  size_type local_58;
  pointer local_50;
  undefined8 local_48;
  undefined8 local_40;
  char *local_38;
  undefined8 local_30;
  
  psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     (*(lgs->
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_140 = local_130;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,pcVar1,pcVar1 + psVar2->_M_string_length);
  cmLocalGenerator::GetProjectName_abi_cxx11_
            (&local_120,
             *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start);
  local_88.first._M_len = local_138;
  local_88.first._M_str = (char *)local_140;
  local_88.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_c0 = 0;
  local_b8 = 1;
  local_a8[0] = 0x2f;
  local_70 = 1;
  local_60 = 0;
  local_58 = local_120._M_string_length;
  local_50 = local_120._M_dataplus._M_p;
  local_48 = 0;
  local_40 = 4;
  local_38 = ".cbp";
  local_30 = 0;
  views._M_len = 4;
  views._M_array = &local_88;
  local_b0 = local_a8;
  local_68 = local_a8;
  cmCatViews(&local_100,views);
  local_88.first._M_len = local_138;
  local_88.first._M_str = (char *)local_140;
  local_88.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_c0 = 0;
  local_b8 = 1;
  local_a8[0] = 0x2f;
  local_70 = 1;
  local_60 = 0;
  local_58 = local_120._M_string_length;
  local_50 = local_120._M_dataplus._M_p;
  local_48 = 0;
  local_40 = 7;
  local_38 = ".layout";
  local_30 = 0;
  views_00._M_len = 4;
  views_00._M_array = &local_88;
  local_b0 = local_a8;
  local_68 = local_a8;
  cmCatViews(&local_e0,views_00);
  CreateNewProjectFile(this,lgs,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_140 != local_130) {
    operator_delete(local_140,local_130[0] + 1);
  }
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::CreateProjectFile(
  const std::vector<cmLocalGenerator*>& lgs)
{
  std::string outputDir = lgs[0]->GetCurrentBinaryDirectory();
  std::string projectName = lgs[0]->GetProjectName();

  std::string filename = cmStrCat(outputDir, '/', projectName, ".cbp");
  std::string sessionFilename =
    cmStrCat(outputDir, '/', projectName, ".layout");

  this->CreateNewProjectFile(lgs, filename);
}